

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QPolygon * __thiscall QGraphicsView::mapFromScene(QGraphicsView *this,QPolygonF *polygon)

{
  bool bVar1;
  const_iterator o;
  QPointF *point_00;
  QGraphicsView *in_RDX;
  QList<QPointF> *in_RDI;
  long in_FS_OFFSET;
  QPointF *point;
  QPolygonF *__range1;
  QPolygon *poly;
  const_iterator __end1;
  const_iterator __begin1;
  rvalue_ref in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar2;
  const_iterator local_10;
  qsizetype asize;
  
  asize = *(qsizetype *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QPointF *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QPolygon::QPolygon((QPolygon *)0xa3b016);
  QList<QPointF>::size((QList<QPointF> *)in_RDX);
  QList<QPoint>::reserve((QList<QPoint> *)CONCAT17(uVar2,in_stack_ffffffffffffffb8),asize);
  local_10.i = (QPointF *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QPointF>::begin(in_RDI);
  o = QList<QPointF>::end(in_RDI);
  while (bVar1 = QList<QPointF>::const_iterator::operator!=(&local_10,o), bVar1) {
    point_00 = QList<QPointF>::const_iterator::operator*(&local_10);
    mapFromScene(in_RDX,point_00);
    QList<QPoint>::operator<<((QList<QPoint> *)in_RDI,in_stack_ffffffffffffff88);
    QList<QPointF>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != asize) {
    __stack_chk_fail();
  }
  return (QPolygon *)in_RDI;
}

Assistant:

QPolygon QGraphicsView::mapFromScene(const QPolygonF &polygon) const
{
    QPolygon poly;
    poly.reserve(polygon.size());
    for (const QPointF &point : polygon)
        poly << mapFromScene(point);
    return poly;
}